

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<unsigned_int,_long,_9>::Multiply(uint *t,long *u,uint *ret)

{
  bool bVar1;
  uint *in_RDX;
  undefined8 *in_RSI;
  uint32_t tmp;
  int64_t u1;
  uint in_stack_ffffffffffffffd0;
  uint u_00;
  bool local_1;
  
  u_00 = 0;
  bVar1 = LargeIntRegMultiply<unsigned_int,_long>::RegMultiply
                    ((uint32_t)in_RDX,(int64_t *)*in_RSI,
                     (uint32_t *)(ulong)in_stack_ffffffffffffffd0);
  if ((bVar1) && (bVar1 = SafeCastHelper<unsigned_int,_unsigned_int,_0>::Cast(u_00,in_RDX), bVar1))
  {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Multiply(const T& t, const U& u, T& ret) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<U>::isInt64, "U must be Int64");
        std::int64_t          u1 = u;
        std::uint32_t tmp = 0;

        if( LargeIntRegMultiply< std::uint32_t, std::int64_t >::RegMultiply( (std::uint32_t)t, u1, &tmp ) &&
            SafeCastHelper< T, std::uint32_t, GetCastMethod< T, std::uint32_t >::method >::Cast(tmp, ret) )
        {
            return true;
        }

        return false;
    }